

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::_::DebugComparison<long&,unsigned_long&>&>
          (String *__return_storage_ptr__,kj *this,DebugComparison<long_&,_unsigned_long_&> *params)

{
  kj *this_00;
  DebugComparison<long_&,_unsigned_long_&> *value;
  String local_30;
  kj *local_18;
  DebugComparison<long_&,_unsigned_long_&> *params_local;
  
  local_18 = this;
  params_local = (DebugComparison<long_&,_unsigned_long_&> *)__return_storage_ptr__;
  this_00 = (kj *)fwd<kj::_::DebugComparison<long&,unsigned_long&>&>
                            ((DebugComparison<long_&,_unsigned_long_&> *)this);
  toCharSequence<kj::_::DebugComparison<long&,unsigned_long&>&>(&local_30,this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}